

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int update_1rtt_egress_key(quicly_conn_t *conn)

{
  uint64_t *puVar1;
  st_quicly_application_space_t *psVar2;
  int iVar3;
  ptls_cipher_suite_t *cipher;
  
  psVar2 = conn->application;
  cipher = ptls_get_cipher((conn->crypto).tls);
  iVar3 = update_1rtt_key(conn,cipher,1,(ptls_aead_context_t **)&(psVar2->cipher).egress,
                          (psVar2->cipher).egress.secret);
  if (iVar3 == 0) {
    puVar1 = &(psVar2->cipher).egress.key_phase;
    *puVar1 = *puVar1 + 1;
    (psVar2->cipher).egress.key_update_pn.last = (conn->egress).packet_number;
    (psVar2->cipher).egress.key_update_pn.next = 0xffffffffffffffff;
  }
  return iVar3;
}

Assistant:

static int update_1rtt_egress_key(quicly_conn_t *conn)
{
    struct st_quicly_application_space_t *space = conn->application;
    ptls_cipher_suite_t *cipher = ptls_get_cipher(conn->crypto.tls);
    int ret;

    /* generate next AEAD key, and increment key phase if it succeeds */
    if ((ret = update_1rtt_key(conn, cipher, 1, &space->cipher.egress.key.aead, space->cipher.egress.secret)) != 0)
        return ret;
    ++space->cipher.egress.key_phase;

    /* signal that we are waiting for an ACK */
    space->cipher.egress.key_update_pn.last = conn->egress.packet_number;
    space->cipher.egress.key_update_pn.next = UINT64_MAX;

    QUICLY_PROBE(CRYPTO_SEND_KEY_UPDATE, conn, conn->stash.now, space->cipher.egress.key_phase,
                 QUICLY_PROBE_HEXDUMP(space->cipher.egress.secret, cipher->hash->digest_size));

    return 0;
}